

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

size_t kvtree_persist_size(kvtree *hash)

{
  size_t sVar1;
  
  sVar1 = kvtree_pack_size(hash);
  return sVar1 + 0x18;
}

Assistant:

size_t kvtree_persist_size(const kvtree* hash)
{
  /* compute the size of the file (includes header, data, and
   * trailing crc32) */
  size_t pack_size = kvtree_pack_size(hash);
  size_t size = KVTREE_FILE_HASH_HEADER_SIZE + pack_size;

  /* add room for the crc32 value */
  size += sizeof(uint32_t);

  return size;
}